

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_hex4.c
# Opt level: O0

void parse_hex4_should_parse_all_combinations(void)

{
  int iVar1;
  uint uVar2;
  long in_FS_OFFSET;
  uint local_20;
  uchar local_1c [4];
  uint number;
  uchar digits_upper [6];
  uchar digits_lower [6];
  
  unique0x00012000 = *(long *)(in_FS_OFFSET + 0x28);
  for (local_20 = 0; local_20 < 0x10000; local_20 = local_20 + 1) {
    iVar1 = sprintf((char *)((long)&number + 2),"%.4x",(ulong)local_20);
    UnityAssertEqualNumber(4,(long)iVar1,"sprintf failed.",0x27,UNITY_DISPLAY_STYLE_INT);
    iVar1 = sprintf((char *)local_1c,"%.4X",(ulong)local_20);
    UnityAssertEqualNumber(4,(long)iVar1,"sprintf failed.",0x28,UNITY_DISPLAY_STYLE_INT);
    uVar2 = parse_hex4((uchar *)((long)&number + 2));
    UnityAssertEqualNumber
              ((ulong)local_20,(ulong)uVar2,"Failed to parse lowercase digits.",0x2a,
               UNITY_DISPLAY_STYLE_INT);
    uVar2 = parse_hex4(local_1c);
    UnityAssertEqualNumber
              ((ulong)local_20,(ulong)uVar2,"Failed to parse uppercase digits.",0x2b,
               UNITY_DISPLAY_STYLE_INT);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == stack0xfffffffffffffff0) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void parse_hex4_should_parse_all_combinations(void)
{
    unsigned int number = 0;
    unsigned char digits_lower[6];
    unsigned char digits_upper[6];
    /* test all combinations */
    for (number = 0; number <= 0xFFFF; number++)
    {
        TEST_ASSERT_EQUAL_INT_MESSAGE(4, sprintf((char*)digits_lower, "%.4x", number), "sprintf failed.");
        TEST_ASSERT_EQUAL_INT_MESSAGE(4, sprintf((char*)digits_upper, "%.4X", number), "sprintf failed.");

        TEST_ASSERT_EQUAL_INT_MESSAGE(number, parse_hex4(digits_lower), "Failed to parse lowercase digits.");
        TEST_ASSERT_EQUAL_INT_MESSAGE(number, parse_hex4(digits_upper), "Failed to parse uppercase digits.");
    }
}